

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void welcomeScreen(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"              ___     ___");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"             |   |   |   |");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"             |___|   |___|");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout," __            |       |            __");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"|  |___        |       |        ___|  |");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"|__|   |     __|_______|__     |   |__|");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"       |____|             |____|");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout," __         |             |         __");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"|  |________|   GDS-cpp   |________|  |");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"|__|        |             |        |__|");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"        ____|             |____");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout," __    |    |_____________|    |    __");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"|  |___|       |       |       |___|  |");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"|__|           |       |           |__|");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"              _|_     _|_");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"             |   |   |   |");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"             |___|   |___|");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void welcomeScreen()
{
  cout << "              ___     ___" << endl;
  cout << "             |   |   |   |" << endl;
  cout << "             |___|   |___|" << endl;
  cout << " __            |       |            __" << endl;
  cout << "|  |___        |       |        ___|  |" << endl;
  cout << "|__|   |     __|_______|__     |   |__|" << endl;
  cout << "       |____|             |____|" << endl;
  cout << " __         |             |         __" << endl;
  cout << "|  |________|   GDS-cpp   |________|  |" << endl;
  cout << "|__|        |             |        |__|" << endl;
  cout << "        ____|             |____" << endl;
  cout << " __    |    |_____________|    |    __" << endl;
  cout << "|  |___|       |       |       |___|  |" << endl;
  cout << "|__|           |       |           |__|" << endl;
  cout << "              _|_     _|_" << endl;
  cout << "             |   |   |   |" << endl;
  cout << "             |___|   |___|" << endl;
}